

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O3

int prune_mode_by_skip_rd
              (AV1_COMP *cpi,MACROBLOCK *x,MACROBLOCKD *xd,BLOCK_SIZE bsize,int64_t ref_skip_rd,
              int mode_rate)

{
  BLOCK_SIZE BVar1;
  int iVar2;
  int iVar3;
  int64_t iVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  _func_int64_t_uint8_t_ptr_int_uint8_t_ptr_int_int_int **pp_Var10;
  long lVar11;
  byte bVar12;
  
  lVar11 = (long)(cpi->sf).inter_sf.txfm_rd_gate_level
                 [(ulong)(((cpi->common).seq_params)->enable_masked_compound != '\0') * 2];
  if (lVar11 == 0) {
    return 1;
  }
  iVar2 = xd->plane[0].subsampling_x;
  iVar3 = xd->plane[0].subsampling_y;
  BVar1 = av1_ss_size_lookup[bsize][iVar2][iVar3];
  uVar9 = (uint)block_size_high[BVar1];
  if (xd->mb_to_bottom_edge < 0) {
    uVar8 = (xd->mb_to_bottom_edge >> ((char)iVar3 + 3U & 0x1f)) + (uint)block_size_high[BVar1];
    uVar9 = 0;
    if (0 < (int)uVar8) {
      uVar9 = uVar8;
    }
  }
  uVar8 = (uint)block_size_wide[BVar1];
  if (xd->mb_to_right_edge < 0) {
    uVar7 = (xd->mb_to_right_edge >> ((char)iVar2 + 3U & 0x1f)) + (uint)block_size_wide[BVar1];
    uVar8 = 0;
    if (0 < (int)uVar7) {
      uVar8 = uVar7;
    }
  }
  iVar2 = xd->bd;
  if ((xd->cur_buf->flags & 8) == 0) {
    pp_Var10 = &aom_sse;
  }
  else {
    pp_Var10 = &aom_highbd_sse;
  }
  iVar4 = (**pp_Var10)(x->plane[0].src.buf,x->plane[0].src.stride,xd->plane[0].dst.buf,
                       xd->plane[0].dst.stride,uVar8,uVar9);
  bVar12 = (char)iVar2 * '\x02' - 0x10;
  lVar5 = 4;
  if ((long)(ulong)(x->source_variance <<
                   ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[bsize] + 7 & 0x1f))
      < ref_skip_rd) {
    if (*(int *)(&DAT_0055e7f0 + lVar11 * 4) <= x->qindex) {
      lVar5 = (long)*(int *)(&DAT_0055e7d0 + lVar11 * 4) << 2;
    }
    lVar6 = 0x7fffffffffffffff;
    if (ref_skip_rd == 0x7fffffffffffffff) goto LAB_003b7752;
  }
  lVar6 = lVar5 * ref_skip_rd * (long)*(int *)(&DAT_0055e810 + lVar11 * 4) >> 6;
LAB_003b7752:
  return (uint)(((long)((ulong)((uint)(1 << (bVar12 & 0x1f)) >> 1) + iVar4) >> (bVar12 & 0x3f)) *
                0x800 + ((long)x->rdmult * (long)mode_rate + 0x100 >> 9) <= lVar6);
}

Assistant:

static inline int prune_mode_by_skip_rd(const AV1_COMP *const cpi,
                                        MACROBLOCK *x, MACROBLOCKD *xd,
                                        const BLOCK_SIZE bsize,
                                        int64_t ref_skip_rd, int mode_rate) {
  int eval_txfm = 1;
  const int txfm_rd_gate_level =
      get_txfm_rd_gate_level(cpi->common.seq_params->enable_masked_compound,
                             cpi->sf.inter_sf.txfm_rd_gate_level, bsize,
                             TX_SEARCH_COMP_TYPE_MODE, /*eval_motion_mode=*/0);
  // Check if the mode is good enough based on skip rd
  if (txfm_rd_gate_level) {
    int64_t sse_y = compute_sse_plane(x, xd, PLANE_TYPE_Y, bsize);
    int64_t skip_rd = RDCOST(x->rdmult, mode_rate, (sse_y << 4));
    eval_txfm =
        check_txfm_eval(x, bsize, ref_skip_rd, skip_rd, txfm_rd_gate_level, 1);
  }
  return eval_txfm;
}